

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O1

aiReturn __thiscall Assimp::Importer::RegisterLoader(Importer *this,BaseImporter *pImp)

{
  pointer *pppBVar1;
  _Rb_tree_header *p_Var2;
  pointer ppBVar3;
  ImporterPimpl *pIVar4;
  iterator __position;
  size_t sVar5;
  Logger *pLVar6;
  _Base_ptr p_Var7;
  string baked;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  st;
  BaseImporter *local_220;
  char *local_218;
  char local_208 [16];
  char *local_1f8;
  long local_1f0;
  char local_1e8 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  undefined1 local_1a8 [376];
  
  local_220 = pImp;
  if (pImp != (BaseImporter *)0x0) {
    p_Var2 = &local_1d8._M_impl.super__Rb_tree_header;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1f8 = local_1e8;
    local_1f0 = 0;
    local_1e8[0] = '\0';
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    BaseImporter::GetExtensionList
              (pImp,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1d8);
    if ((_Rb_tree_header *)local_1d8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var7 = local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        sVar5 = GetImporterIndex(this,*(char **)(p_Var7 + 1));
        ppBVar3 = (this->pimpl->mImporter).
                  super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((sVar5 < (ulong)((long)(this->pimpl->mImporter).
                                   super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar3 >> 3))
           && (ppBVar3[sVar5] != (BaseImporter *)0x0)) {
          pLVar6 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[20]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,(char (*) [20])"The file extension ");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," is already in use",0x12);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar6,local_218);
          if (local_218 != local_208) {
            operator_delete(local_218);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        }
        std::__cxx11::string::_M_append((char *)&local_1f8,*(ulong *)(p_Var7 + 1));
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var2);
    }
    pIVar4 = this->pimpl;
    __position._M_current =
         (pIVar4->mImporter).
         super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pIVar4->mImporter).
        super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
      _M_realloc_insert<Assimp::BaseImporter*const&>
                ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)
                 &pIVar4->mImporter,__position,&local_220);
    }
    else {
      *__position._M_current = local_220;
      pppBVar1 = &(pIVar4->mImporter).
                  super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
    pLVar6 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[56]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [56])"Registering custom importer for these file extensions: ");
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1f8,local_1f0);
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar6,local_218);
    if (local_218 != local_208) {
      operator_delete(local_218);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1d8);
    return aiReturn_SUCCESS;
  }
  __assert_fail("__null != pImp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/Importer.cpp"
                ,0xda,"aiReturn Assimp::Importer::RegisterLoader(BaseImporter *)");
}

Assistant:

aiReturn Importer::RegisterLoader(BaseImporter* pImp)
{
    ai_assert(NULL != pImp);
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // --------------------------------------------------------------------
    // Check whether we would have two loaders for the same file extension
    // This is absolutely OK, but we should warn the developer of the new
    // loader that his code will probably never be called if the first
    // loader is a bit too lazy in his file checking.
    // --------------------------------------------------------------------
    std::set<std::string> st;
    std::string baked;
    pImp->GetExtensionList(st);

    for(std::set<std::string>::const_iterator it = st.begin(); it != st.end(); ++it) {

#ifdef ASSIMP_BUILD_DEBUG
        if (IsExtensionSupported(*it)) {
            ASSIMP_LOG_WARN_F("The file extension ", *it, " is already in use");
        }
#endif
        baked += *it;
    }

    // add the loader
    pimpl->mImporter.push_back(pImp);
    ASSIMP_LOG_INFO_F("Registering custom importer for these file extensions: ", baked);
    ASSIMP_END_EXCEPTION_REGION(aiReturn);
    return AI_SUCCESS;
}